

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<CTilesetMapper::CRuleSet,_allocator_default<CTilesetMapper::CRuleSet>_>::alloc
          (array<CTilesetMapper::CRuleSet,_allocator_default<CTilesetMapper::CRuleSet>_> *this,
          int new_len)

{
  CRuleSet *pCVar1;
  uint uVar2;
  int iVar3;
  CRuleSet *pCVar4;
  long lVar5;
  array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_> *this_00;
  
  this->list_size = new_len;
  pCVar4 = allocator_default<CTilesetMapper::CRuleSet>::alloc_array(new_len);
  uVar2 = this->list_size;
  if (this->num_elements < this->list_size) {
    uVar2 = this->num_elements;
  }
  if (0 < (int)uVar2) {
    this_00 = &pCVar4->m_aRules;
    lVar5 = 0;
    do {
      pCVar1 = this->list;
      memcpy(&this_00[-9].list_size,pCVar1->m_aName + lVar5,0x84);
      array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>::operator=
                (this_00,(array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_> *)
                         ((long)&(pCVar1->m_aRules).list + lVar5));
      this_00 = (array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_> *)
                &this_00[9].list_size;
      lVar5 = lVar5 + 0x98;
    } while ((ulong)uVar2 * 0x98 - lVar5 != 0);
  }
  allocator_default<CTilesetMapper::CRuleSet>::free_array(this->list);
  iVar3 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar3 = this->num_elements;
  }
  this->num_elements = iVar3;
  this->list = pCVar4;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}